

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall NumberTemp::Dump(NumberTemp *this,char16 *traceName)

{
  char16 *traceName_local;
  NumberTemp *this_local;
  
  if ((this->nonTempElemLoad & 1U) == 0) {
    Output::Print(L"%s: Non Temp Syms",traceName);
    BVSparse<Memory::JitArenaAllocator>::Dump((BVSparse<Memory::JitArenaAllocator> *)this);
    if (this->propertyIdsTempTransferDependencies !=
        (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
      Output::Print(L"%s: Temp transfer propertyId dependencies:\n",traceName);
      HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Dump
                (this->propertyIdsTempTransferDependencies,2);
    }
  }
  else {
    Output::Print(L"%s: Has Non Temp Elem Load\n",traceName);
  }
  return;
}

Assistant:

void
NumberTemp::Dump(char16 const * traceName)
{
    if (nonTempElemLoad)
    {
        Output::Print(_u("%s: Has Non Temp Elem Load\n"), traceName);
    }
    else
    {
        Output::Print(_u("%s: Non Temp Syms"), traceName);
        this->nonTempSyms.Dump();
        if (this->propertyIdsTempTransferDependencies != nullptr)
        {
            Output::Print(_u("%s: Temp transfer propertyId dependencies:\n"), traceName);
            this->propertyIdsTempTransferDependencies->Dump();
        }
    }
}